

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op.cc
# Opt level: O3

void __thiscall IopSpace::restoreXml(IopSpace *this,Element *el)

{
  LowlevelError *this_00;
  string local_40;
  
  this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Should never restore iop space from XML","");
  LowlevelError::LowlevelError(this_00,&local_40);
  __cxa_throw(this_00,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
}

Assistant:

void IopSpace::restoreXml(const Element *el)

{
  throw LowlevelError("Should never restore iop space from XML");
}